

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O3

bool __thiscall
tinyobj::MaterialStreamReader::operator()
          (MaterialStreamReader *this,string *matId,
          vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *materials,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          *matMap,string *err)

{
  uint uVar1;
  istream *inStream;
  char cVar2;
  string warning;
  long *local_1c0;
  size_type local_1b8;
  long local_1b0 [2];
  undefined1 local_1a0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190 [7];
  ios_base local_120 [264];
  
  inStream = this->m_inStream;
  uVar1 = *(uint *)(inStream + *(long *)(*(long *)inStream + -0x18) + 0x20);
  if ((uVar1 & 5) == 0) {
    local_1a0._8_8_ = 0;
    local_190[0]._M_local_buf[0] = '\0';
    local_1a0._0_8_ = local_1a0 + 0x10;
    LoadMtl(matMap,materials,inStream,(string *)local_1a0);
    if (err != (string *)0x0 && local_1a0._8_8_ != 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (err,(char *)local_1a0._0_8_,local_1a0._8_8_);
    }
    if ((undefined1 *)local_1a0._0_8_ != local_1a0 + 0x10) {
      operator_delete((void *)local_1a0._0_8_,
                      CONCAT71(local_190[0]._M_allocated_capacity._1_7_,local_190[0]._M_local_buf[0]
                              ) + 1);
    }
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1a0 + 0x10),"WARN: Material stream in error state. ",0x26);
    cVar2 = (char)(ostream *)(local_1a0 + 0x10);
    std::ios::widen((char)*(undefined8 *)
                           (CONCAT71(local_190[0]._M_allocated_capacity._1_7_,
                                     local_190[0]._M_local_buf[0]) + -0x18) + cVar2);
    std::ostream::put(cVar2);
    std::ostream::flush();
    if (err != (string *)0x0) {
      std::__cxx11::stringbuf::str();
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (err,(char *)local_1c0,local_1b8);
      if (local_1c0 != local_1b0) {
        operator_delete(local_1c0,local_1b0[0] + 1);
      }
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
    std::ios_base::~ios_base(local_120);
  }
  return (uVar1 & 5) == 0;
}

Assistant:

bool MaterialStreamReader::operator()(const std::string &matId,
                                      std::vector<material_t> *materials,
                                      std::map<std::string, int> *matMap,
                                      std::string *err) {
  (void)matId;
  if (!m_inStream) {
    std::stringstream ss;
    ss << "WARN: Material stream in error state. " << std::endl;
    if (err) {
      (*err) += ss.str();
    }
    return false;
  }

  std::string warning;
  LoadMtl(matMap, materials, &m_inStream, &warning);

  if (!warning.empty()) {
    if (err) {
      (*err) += warning;
    }
  }

  return true;
}